

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O1

Gnuplot * __thiscall Gnuplot::cmd(Gnuplot *this,string *cmdstr)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  long *local_48 [2];
  long local_38 [2];
  
  if (this->valid == true) {
    pcVar1 = (cmdstr->_M_dataplus)._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + cmdstr->_M_string_length);
    std::__cxx11::string::append((char *)local_48);
    fputs((char *)local_48[0],(FILE *)this->gnucmd);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    fflush((FILE *)this->gnucmd);
    lVar2 = std::__cxx11::string::find((char *)cmdstr,0x1060ce,0);
    if (lVar2 == -1) {
      bVar3 = false;
      lVar2 = std::__cxx11::string::find((char *)cmdstr,0x1060d5,0);
      if (lVar2 == -1) {
        lVar2 = std::__cxx11::string::find((char *)cmdstr,0x1060d0,0);
        bVar3 = true;
        if (lVar2 == -1) {
          return this;
        }
      }
      this->two_dim = bVar3;
      this->nplots = this->nplots + 1;
    }
  }
  return this;
}

Assistant:

Gnuplot& Gnuplot::cmd(const std::string &cmdstr) {
  if (!(valid)) {
    return *this;
  }

  // int fputs ( const char * str, FILE * stream );
  // writes the string str to the stream.
  // The function begins copying from the address specified (str) until it
  // reaches the terminating null character ('\0'). This final
  // null-character is not copied to the stream.
  fputs((cmdstr + "\n").c_str(), gnucmd);

  // int fflush ( FILE * stream );
  // If the given stream was open for writing and the last i/o operation was
  // an output operation, any unwritten data in the output buffer is written
  // to the file.  If the argument is a null pointer, all open files are
  // flushed.  The stream remains open after this call.
  fflush(gnucmd);

  if (cmdstr.find("replot") != std::string::npos) {
    return *this;
  } else if (cmdstr.find("splot") != std::string::npos) {
    two_dim = false;
    nplots++;
  } else if (cmdstr.find("plot") != std::string::npos) {
    two_dim = true;
    nplots++;
  }

  return *this;
}